

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void emit_op_tforcall(function *fn,int A,int B,int C,int j,int jA,int pc)

{
  int jA_local;
  int j_local;
  int C_local;
  int B_local;
  int A_local;
  function *fn_local;
  
  emit_update_savedpc(fn,pc);
  emit_reg(fn,"ra",A);
  membuff_add_string(&fn->body,"rb = ra + 3 + 2;\n");
  membuff_add_string(&fn->body,"rc = ra + 2;\n");
  membuff_add_string(&fn->body,"setobjs2s(L, rb, rc);\n");
  membuff_add_string(&fn->body,"rb = ra + 3 + 1;\n");
  membuff_add_string(&fn->body,"rc = ra + 1;\n");
  membuff_add_string(&fn->body,"setobjs2s(L, rb, rc);\n");
  membuff_add_string(&fn->body,"rb = ra + 3;\n");
  membuff_add_string(&fn->body,"setobjs2s(L, rb, ra);\n");
  membuff_add_string(&fn->body,"L->top = rb + 3;\n");
  membuff_add_fstring(&fn->body,"luaD_call(L, rb, %d);\n",(ulong)(uint)C);
  membuff_add_string(&fn->body,"base = ci->u.l.base;\n");
  membuff_add_string(&fn->body,"L->top = ci->top;\n");
  emit_reg(fn,"ra",jA);
  membuff_add_string(&fn->body,"if (!ttisnil(ra + 1)) {\n");
  membuff_add_string(&fn->body," rb = ra + 1;\n");
  membuff_add_string(&fn->body," setobjs2s(L, ra, rb);\n");
  membuff_add_fstring(&fn->body," goto Lbc_%d;\n",(ulong)(uint)j);
  membuff_add_string(&fn->body,"}\n");
  return;
}

Assistant:

static void emit_op_tforcall(struct function *fn, int A, int B, int C, int j, int jA, int pc) {
  (void)B;
  emit_update_savedpc(fn, pc);
  emit_reg(fn, "ra", A);
  membuff_add_string(&fn->body, "rb = ra + 3 + 2;\n"); /*rb = cb*/
  membuff_add_string(&fn->body, "rc = ra + 2;\n");     /*rb = cb*/
  membuff_add_string(&fn->body, "setobjs2s(L, rb, rc);\n");
  membuff_add_string(&fn->body, "rb = ra + 3 + 1;\n"); /*rb = cb*/
  membuff_add_string(&fn->body, "rc = ra + 1;\n");     /*rb = cb*/
  membuff_add_string(&fn->body, "setobjs2s(L, rb, rc);\n");
  membuff_add_string(&fn->body, "rb = ra + 3;\n"); /*rb = cb*/
  membuff_add_string(&fn->body, "setobjs2s(L, rb, ra);\n");
  membuff_add_string(&fn->body, "L->top = rb + 3;\n");
  membuff_add_fstring(&fn->body, "luaD_call(L, rb, %d);\n", C);
  membuff_add_string(&fn->body, "base = ci->u.l.base;\n");
  membuff_add_string(&fn->body, "L->top = ci->top;\n");
  emit_reg(fn, "ra", jA);
  membuff_add_string(&fn->body, "if (!ttisnil(ra + 1)) {\n");
  membuff_add_string(&fn->body, " rb = ra + 1;\n");
  membuff_add_string(&fn->body, " setobjs2s(L, ra, rb);\n");
  membuff_add_fstring(&fn->body, " goto Lbc_%d;\n", j);
  membuff_add_string(&fn->body, "}\n");
}